

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerBreakpointManager.cxx
# Opt level: O2

vector<long,_std::allocator<long>_> * __thiscall
cmDebugger::cmDebuggerBreakpointManager::GetBreakpoints
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,
          cmDebuggerBreakpointManager *this,string *sourcePath,int64_t line)

{
  mapped_type *pmVar1;
  long lVar2;
  long lVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  int64_t local_48;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->Mutex);
  pmVar1 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->Breakpoints,sourcePath);
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar6 = (pmVar1->
           super__Vector_base<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar5 = (pmVar1->
           super__Vector_base<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar6 != pcVar5) {
    do {
      lVar3 = (long)pcVar5 - (long)pcVar6;
      pcVar6 = pcVar6 + 2;
      for (lVar2 = lVar3 / 0x18 >> 2; 0 < lVar2; lVar2 = lVar2 + -1) {
        if ((pcVar6[-2].IsValid == true) && (pcVar6[-2].Line == line)) {
          pcVar4 = pcVar6 + -2;
          goto LAB_0043fa02;
        }
        if ((pcVar6[-1].IsValid == true) && (pcVar6[-1].Line == line)) {
          pcVar4 = pcVar6 + -1;
          goto LAB_0043fa02;
        }
        if ((pcVar6->IsValid == true) && (pcVar4 = pcVar6, pcVar6->Line == line)) goto LAB_0043fa02;
        if ((pcVar6[1].IsValid == true) && (pcVar6[1].Line == line)) {
          pcVar4 = pcVar6 + 1;
          goto LAB_0043fa02;
        }
        pcVar6 = pcVar6 + 4;
        lVar3 = lVar3 + -0x60;
      }
      lVar3 = lVar3 / 0x18;
      pcVar4 = pcVar6 + -2;
      if (lVar3 == 1) {
LAB_0043f9f6:
        if ((pcVar4->IsValid != true) || (pcVar4->Line != line)) break;
      }
      else if (lVar3 == 3) {
        if ((pcVar6[-2].IsValid != true) || (pcVar6[-2].Line != line)) {
          pcVar4 = pcVar6 + -1;
          goto LAB_0043f9e6;
        }
      }
      else {
        if (lVar3 != 2) break;
LAB_0043f9e6:
        if ((pcVar4->IsValid != true) || (pcVar4->Line != line)) {
          pcVar4 = pcVar4 + 1;
          goto LAB_0043f9f6;
        }
      }
LAB_0043fa02:
      if (pcVar4 == pcVar5) break;
      local_48 = pcVar4->Id;
      std::vector<long,_std::allocator<long>_>::emplace_back<long>(__return_storage_ptr__,&local_48)
      ;
      pcVar6 = pcVar4 + 1;
      pcVar5 = (pmVar1->
               super__Vector_base<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    } while( true );
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int64_t> cmDebuggerBreakpointManager::GetBreakpoints(
  std::string const& sourcePath, int64_t line)
{
  std::unique_lock<std::mutex> lock(Mutex);
  const auto& all = Breakpoints[sourcePath];
  std::vector<int64_t> breakpoints;
  if (all.empty()) {
    return breakpoints;
  }

  auto it = all.begin();

  while ((it = std::find_if(
            it, all.end(), [&](const cmDebuggerSourceBreakpoint& breakpoint) {
              return (breakpoint.GetIsValid() && breakpoint.GetLine() == line);
            })) != all.end()) {
    breakpoints.emplace_back(it->GetId());
    ++it;
  }

  return breakpoints;
}